

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3.cpp
# Opt level: O3

void * rw::gl3::driverOpen(void *o,int32 param_2,int32 param_3)

{
  long lVar1;
  long lVar2;
  
  lVar2 = engine;
  lVar1 = *(long *)(engine + 0xb8);
  *(undefined4 *)(lVar1 + 8) = nativeRasterOffset;
  *(code **)(lVar1 + 0x10) = rasterCreate;
  *(code **)(*(long *)(lVar2 + 0xb8) + 0x18) = rasterLock;
  *(code **)(*(long *)(lVar2 + 0xb8) + 0x20) = rasterUnlock;
  *(code **)(*(long *)(lVar2 + 0xb8) + 0x38) = rasterNumLevels;
  *(code **)(*(long *)(lVar2 + 0xb8) + 0x40) = imageFindRasterFormat;
  *(code **)(*(long *)(lVar2 + 0xb8) + 0x48) = rasterFromImage;
  *(code **)(*(long *)(lVar2 + 0xb8) + 0x50) = rasterToImage;
  return o;
}

Assistant:

static void*
driverOpen(void *o, int32, int32)
{
#ifdef RW_OPENGL
	engine->driver[PLATFORM_GL3]->defaultPipeline = makeDefaultPipeline();
#endif
	engine->driver[PLATFORM_GL3]->rasterNativeOffset = nativeRasterOffset;
	engine->driver[PLATFORM_GL3]->rasterCreate       = rasterCreate;
	engine->driver[PLATFORM_GL3]->rasterLock         = rasterLock;
	engine->driver[PLATFORM_GL3]->rasterUnlock       = rasterUnlock;
	engine->driver[PLATFORM_GL3]->rasterNumLevels    = rasterNumLevels;
	engine->driver[PLATFORM_GL3]->imageFindRasterFormat = imageFindRasterFormat;
	engine->driver[PLATFORM_GL3]->rasterFromImage    = rasterFromImage;
	engine->driver[PLATFORM_GL3]->rasterToImage      = rasterToImage;

	return o;
}